

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psset.c
# Opt level: O1

void psset_stats_insert(psset_t *psset,hpdata_t *ps)

{
  size_t *psVar1;
  pszind_t pVar2;
  size_t sVar3;
  psset_bin_stats_t *ppVar4;
  long lVar5;
  
  sVar3 = ps->h_nactive;
  if (sVar3 == 0x200) {
    ppVar4 = (psset->stats).full_slabs + ps->h_huge;
  }
  else {
    if (sVar3 != 0) {
      pVar2 = psset_hpdata_heap_index(ps);
      ppVar4 = (psset->stats).nonfull_slabs[pVar2] + ps->h_huge;
      ppVar4->npageslabs = ppVar4->npageslabs + 1;
      sVar3 = ps->h_nactive;
      goto LAB_01c8b643;
    }
    ppVar4 = (psset->stats).empty_slabs + ps->h_huge;
  }
  ppVar4->npageslabs = ppVar4->npageslabs + 1;
LAB_01c8b643:
  ppVar4->nactive = ppVar4->nactive + sVar3;
  lVar5 = ps->h_ntouched - sVar3;
  ppVar4->ndirty = ppVar4->ndirty + lVar5;
  (psset->merged_stats).npageslabs = (psset->merged_stats).npageslabs + 1;
  (psset->merged_stats).nactive = sVar3 + (psset->merged_stats).nactive;
  psVar1 = &(psset->merged_stats).ndirty;
  *psVar1 = *psVar1 + lVar5;
  return;
}

Assistant:

static void
psset_stats_insert(psset_t* psset, hpdata_t *ps) {
	if (hpdata_empty(ps)) {
		psset_bin_stats_insert(psset, psset->stats.empty_slabs, ps);
	} else if (hpdata_full(ps)) {
		psset_bin_stats_insert(psset, psset->stats.full_slabs, ps);
	} else {
		pszind_t pind = psset_hpdata_heap_index(ps);
		psset_bin_stats_insert(psset, psset->stats.nonfull_slabs[pind],
		    ps);
	}
}